

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestRegistryTest.cpp
# Opt level: O3

void __thiscall
IGNORETestRegistry_shuffleTestList_Test::testBody(IGNORETestRegistry_shuffleTestList_Test *this)

{
  TestRegistry *pTVar1;
  MockTest *pMVar2;
  int iVar3;
  undefined4 extraout_var;
  MockTest *pMVar5;
  MockTest *pMVar6;
  UtestShell *pUVar7;
  TestTerminator *pTVar8;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  MockTest *pMVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  CppUTestStore(&PlatformSpecificRand);
  PlatformSpecificRand = getZero;
  pTVar1 = (this->super_TEST_GROUP_CppUTestGroupTestRegistry).myRegistry;
  (*pTVar1->_vptr_TestRegistry[2])(pTVar1,(this->super_TEST_GROUP_CppUTestGroupTestRegistry).test3);
  pTVar1 = (this->super_TEST_GROUP_CppUTestGroupTestRegistry).myRegistry;
  (*pTVar1->_vptr_TestRegistry[2])(pTVar1,(this->super_TEST_GROUP_CppUTestGroupTestRegistry).test2);
  pTVar1 = (this->super_TEST_GROUP_CppUTestGroupTestRegistry).myRegistry;
  (*pTVar1->_vptr_TestRegistry[2])(pTVar1,(this->super_TEST_GROUP_CppUTestGroupTestRegistry).test1);
  iVar3 = (*((this->super_TEST_GROUP_CppUTestGroupTestRegistry).myRegistry)->_vptr_TestRegistry
            [0x13])();
  pMVar4 = (MockTest *)CONCAT44(extraout_var,iVar3);
  iVar3 = (*(pMVar4->super_UtestShell)._vptr_UtestShell[3])(pMVar4);
  pMVar5 = (MockTest *)CONCAT44(extraout_var_00,iVar3);
  iVar3 = (*(pMVar5->super_UtestShell)._vptr_UtestShell[3])(pMVar5);
  pMVar6 = (MockTest *)CONCAT44(extraout_var_01,iVar3);
  pUVar7 = UtestShell::getCurrent();
  pMVar2 = (this->super_TEST_GROUP_CppUTestGroupTestRegistry).test1;
  pTVar8 = UtestShell::getCurrentTestTerminator();
  (*pUVar7->_vptr_UtestShell[8])
            (pUVar7,(ulong)(pMVar4 == pMVar2),"CHECK_TRUE","first_before == test1",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestRegistryTest.cpp"
             ,0x1a1,pTVar8);
  pUVar7 = UtestShell::getCurrent();
  pMVar2 = (this->super_TEST_GROUP_CppUTestGroupTestRegistry).test2;
  pTVar8 = UtestShell::getCurrentTestTerminator();
  (*pUVar7->_vptr_UtestShell[8])
            (pUVar7,(ulong)(pMVar5 == pMVar2),"CHECK_TRUE","second_before == test2",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestRegistryTest.cpp"
             ,0x1a2,pTVar8);
  pUVar7 = UtestShell::getCurrent();
  pMVar2 = (this->super_TEST_GROUP_CppUTestGroupTestRegistry).test3;
  pTVar8 = UtestShell::getCurrentTestTerminator();
  (*pUVar7->_vptr_UtestShell[8])
            (pUVar7,(ulong)(pMVar6 == pMVar2),"CHECK_TRUE","third_before == test3",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestRegistryTest.cpp"
             ,0x1a3,pTVar8);
  pUVar7 = UtestShell::getCurrent();
  iVar3 = (*(pMVar6->super_UtestShell)._vptr_UtestShell[3])(pMVar6);
  pTVar8 = UtestShell::getCurrentTestTerminator();
  (*pUVar7->_vptr_UtestShell[8])
            (pUVar7,(ulong)(CONCAT44(extraout_var_02,iVar3) == 0),"CHECK_TRUE",
             "third_before->getNext() == NULLPTR",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestRegistryTest.cpp"
             ,0x1a4,pTVar8);
  pTVar1 = (this->super_TEST_GROUP_CppUTestGroupTestRegistry).myRegistry;
  (*pTVar1->_vptr_TestRegistry[6])(pTVar1,0);
  iVar3 = (*((this->super_TEST_GROUP_CppUTestGroupTestRegistry).myRegistry)->_vptr_TestRegistry
            [0x13])();
  pMVar4 = (MockTest *)CONCAT44(extraout_var_03,iVar3);
  iVar3 = (*(pMVar4->super_UtestShell)._vptr_UtestShell[3])(pMVar4);
  pMVar5 = (MockTest *)CONCAT44(extraout_var_04,iVar3);
  iVar3 = (*(pMVar5->super_UtestShell)._vptr_UtestShell[3])(pMVar5);
  pMVar6 = (MockTest *)CONCAT44(extraout_var_05,iVar3);
  pUVar7 = UtestShell::getCurrent();
  pMVar2 = (this->super_TEST_GROUP_CppUTestGroupTestRegistry).test2;
  pTVar8 = UtestShell::getCurrentTestTerminator();
  (*pUVar7->_vptr_UtestShell[8])
            (pUVar7,(ulong)(pMVar4 == pMVar2),"CHECK_TRUE","first_after == test2",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestRegistryTest.cpp"
             ,0x1ad,pTVar8);
  pUVar7 = UtestShell::getCurrent();
  pMVar2 = (this->super_TEST_GROUP_CppUTestGroupTestRegistry).test3;
  pTVar8 = UtestShell::getCurrentTestTerminator();
  (*pUVar7->_vptr_UtestShell[8])
            (pUVar7,(ulong)(pMVar5 == pMVar2),"CHECK_TRUE","second_after == test3",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestRegistryTest.cpp"
             ,0x1ae,pTVar8);
  pUVar7 = UtestShell::getCurrent();
  pMVar2 = (this->super_TEST_GROUP_CppUTestGroupTestRegistry).test1;
  pTVar8 = UtestShell::getCurrentTestTerminator();
  (*pUVar7->_vptr_UtestShell[8])
            (pUVar7,(ulong)(pMVar6 == pMVar2),"CHECK_TRUE","third_after == test1",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestRegistryTest.cpp"
             ,0x1af,pTVar8);
  pUVar7 = UtestShell::getCurrent();
  iVar3 = (*(pMVar6->super_UtestShell)._vptr_UtestShell[3])(pMVar6);
  pTVar8 = UtestShell::getCurrentTestTerminator();
  (*pUVar7->_vptr_UtestShell[8])
            (pUVar7,(ulong)(CONCAT44(extraout_var_06,iVar3) == 0),"CHECK_TRUE",
             "third_after->getNext() == NULLPTR",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestRegistryTest.cpp"
             ,0x1b0,pTVar8);
  return;
}

Assistant:

IGNORE_TEST(TestRegistry, shuffleTestList)
{
    UT_PTR_SET(PlatformSpecificRand, getZero);
    myRegistry->addTest(test3);
    myRegistry->addTest(test2);
    myRegistry->addTest(test1);

    UtestShell* first_before  = myRegistry->getFirstTest();
    UtestShell* second_before = first_before->getNext();
    UtestShell* third_before  = second_before->getNext();

    CHECK_TRUE(first_before  == test1);
    CHECK_TRUE(second_before == test2);
    CHECK_TRUE(third_before  == test3);
    CHECK_TRUE(third_before->getNext()  == NULLPTR);

    // shuffle always with element at index 0: [1] 2 [3] --> [3] [2] 1 --> 2 3 1
    myRegistry->shuffleTests(0);

    UtestShell* first_after  = myRegistry->getFirstTest();
    UtestShell* second_after = first_after->getNext();
    UtestShell* third_after  = second_after->getNext();

    CHECK_TRUE(first_after  == test2);
    CHECK_TRUE(second_after == test3);
    CHECK_TRUE(third_after  == test1);
    CHECK_TRUE(third_after->getNext() == NULLPTR);
}